

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interp.cc
# Opt level: O2

Result ReadAndInstantiateModule(char *module_filename,Errors *errors,Ptr *out_instance)

{
  unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_> stream;
  Index IVar1;
  bool bVar2;
  Result RVar3;
  char *pcVar4;
  FuncType *pFVar5;
  _func_void *p_Var6;
  Ref store;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RCX;
  Enum EVar7;
  Ptr *in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string_view filename;
  _Any_data local_438;
  code *local_428;
  code *pcStack_420;
  RefVec imports;
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  RefPtr<wabt::interp::Trap> trap;
  undefined1 local_3c0 [88];
  Ptr module;
  Ptr host_func;
  string import_name;
  FuncType local_318;
  FuncType func_type;
  ReadBinaryOptions options;
  ModuleDesc module_desc;
  ModuleDesc local_150;
  
  stream._M_t.super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
  super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
  super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl =
       s_stdout_stream._M_t.
       super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
       super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
       super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar4 = (char *)strlen(module_filename);
  filename.size_ = (size_type)&file_data;
  filename.data_ = pcVar4;
  RVar3 = wabt::ReadFile((wabt *)module_filename,filename,in_RCX);
  if (RVar3.enum_ == Error) {
    EVar7 = Error;
  }
  else {
    memset(&module_desc,0,0x120);
    options.features.exceptions_enabled_ = s_features.exceptions_enabled_;
    options.features.mutable_globals_enabled_ = s_features.mutable_globals_enabled_;
    options.features.sat_float_to_int_enabled_ = s_features.sat_float_to_int_enabled_;
    options.features.sign_extension_enabled_ = s_features.sign_extension_enabled_;
    options.features.simd_enabled_ = s_features.simd_enabled_;
    options.features.threads_enabled_ = s_features.threads_enabled_;
    options.features.multi_value_enabled_ = s_features.multi_value_enabled_;
    options.features.tail_call_enabled_ = s_features.tail_call_enabled_;
    options.features.bulk_memory_enabled_ = s_features.bulk_memory_enabled_;
    options.features.reference_types_enabled_ = s_features.reference_types_enabled_;
    options.features.annotations_enabled_ = s_features.annotations_enabled_;
    options.features.gc_enabled_ = s_features.gc_enabled_;
    options.log_stream =
         (Stream *)
         s_log_stream._M_t.
         super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
         super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
         super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl;
    options.read_debug_names = true;
    options.stop_on_first_error = true;
    options.fail_on_custom_section_error = true;
    RVar3 = wabt::interp::ReadBinaryInterp
                      (file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       (long)file_data.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)file_data.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,&options,errors,&module_desc);
    if (RVar3.enum_ == Error) {
      EVar7 = Error;
    }
    else {
      if (s_verbose != 0) {
        wabt::interp::Istream::Disassemble
                  (&module_desc.istream,
                   (Stream *)
                   stream._M_t.
                   super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>
                   .super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl);
      }
      wabt::interp::ModuleDesc::ModuleDesc(&local_150,&module_desc);
      wabt::interp::Module::New(&module,&s_store,&local_150);
      wabt::interp::ModuleDesc::~ModuleDesc(&local_150);
      imports.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      imports.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      imports.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __lhs = &((module_desc.imports.
                 super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>
                 ._M_impl.super__Vector_impl_data._M_start)->type).name;
      while( true ) {
        if (__lhs + -1 ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            module_desc.imports.
            super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>.
            _M_impl.super__Vector_impl_data._M_finish) break;
        if (*(int *)(__lhs[1]._M_dataplus._M_p + 8) == 0) {
          if (s_host_print == '\x01') {
            bVar2 = std::operator==(__lhs + -1,"host");
            if (!bVar2) goto LAB_0014f957;
            bVar2 = std::operator==(__lhs,"print");
            if (!bVar2) goto LAB_0014f957;
          }
          else {
LAB_0014f957:
            if (s_dummy_import_func != '\x01') goto LAB_0014fa14;
          }
          pFVar5 = wabt::cast<wabt::interp::FuncType,wabt::interp::ExternType>
                             ((ExternType *)__lhs[1]._M_dataplus._M_p);
          wabt::interp::FuncType::FuncType(&func_type,pFVar5);
          wabt::StringPrintf_abi_cxx11_
                    (&import_name,"%s.%s",__lhs[-1]._M_dataplus._M_p,(__lhs->_M_dataplus)._M_p);
          wabt::interp::FuncType::FuncType(&local_318,&func_type);
          trap.obj_ = (Trap *)stream._M_t.
                              super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>
                              .super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl;
          std::__cxx11::string::string((string *)&trap.store_,(string *)&import_name);
          wabt::interp::FuncType::FuncType((FuncType *)(local_3c0 + 0x10),&func_type);
          local_428 = (code *)0x0;
          pcStack_420 = (code *)0x0;
          local_438._M_unused._M_object = (void *)0x0;
          local_438._8_8_ = 0;
          p_Var6 = (_func_void *)operator_new(0x68);
          IVar1 = trap.root_index_;
          *(Trap **)p_Var6 = trap.obj_;
          *(_func_void **)(p_Var6 + 8) = p_Var6 + 0x18;
          if (trap.store_ == (Store *)local_3c0) {
            *(ulong *)(p_Var6 + 0x18) = CONCAT71(local_3c0._1_7_,local_3c0[0]);
            *(undefined8 *)(p_Var6 + 0x20) = local_3c0._8_8_;
          }
          else {
            *(Store **)(p_Var6 + 8) = trap.store_;
            *(ulong *)(p_Var6 + 0x18) = CONCAT71(local_3c0._1_7_,local_3c0[0]);
          }
          trap.root_index_ = 0;
          *(Index *)(p_Var6 + 0x10) = IVar1;
          local_3c0[0] = false;
          trap.store_ = (Store *)local_3c0;
          wabt::interp::FuncType::FuncType
                    ((FuncType *)(p_Var6 + 0x28),(FuncType *)(local_3c0 + 0x10));
          pcStack_420 = std::
                        _Function_handler<wabt::Result_(const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm-interp.cc:174:25)>
                        ::_M_invoke;
          local_428 = std::
                      _Function_handler<wabt::Result_(const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm-interp.cc:174:25)>
                      ::_M_manager;
          local_438._M_unused._0_8_ = (undefined8)p_Var6;
          wabt::interp::HostFunc::New(&host_func,&s_store,&local_318,(Callback *)&local_438);
          if (local_428 != (code *)0x0) {
            (*local_428)(&local_438,&local_438,__destroy_functor);
          }
          ReadAndInstantiateModule(char_const*,std::vector<wabt::Error,std::allocator<wabt::Error>>*,wabt::interp::RefPtr<wabt::interp::Instance>*)
          ::$_0::~__0((__0 *)&trap);
          wabt::interp::FuncType::~FuncType(&local_318);
          trap.obj_ = (Trap *)wabt::interp::RefPtr<wabt::interp::HostFunc>::ref(&host_func);
          std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
          emplace_back<wabt::interp::Ref>(&imports,(Ref *)&trap);
          wabt::interp::RefPtr<wabt::interp::HostFunc>::reset(&host_func);
          std::__cxx11::string::_M_dispose();
          wabt::interp::FuncType::~FuncType(&func_type);
        }
        else {
LAB_0014fa14:
          std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                    (&imports,(value_type *)&wabt::interp::Ref::Null);
        }
        __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &__lhs[2]._M_string_length;
      }
      trap.obj_ = (Trap *)0x0;
      trap.store_ = (Store *)0x0;
      trap.root_index_ = 0;
      store = wabt::interp::RefPtr<wabt::interp::Module>::ref(&module);
      wabt::interp::Instance::Instantiate
                ((Ptr *)&func_type,(Instance *)&s_store,(Store *)store.index,(Ref)&imports,
                 (RefVec *)&trap,in_R9);
      out_instance->obj_ = (Instance *)func_type.super_ExternType._vptr_ExternType;
      out_instance->store_ = (Store *)func_type.super_ExternType._8_8_;
      out_instance->root_index_ =
           (Index)func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      func_type.super_ExternType._vptr_ExternType = (_func_int **)0x0;
      func_type.super_ExternType.kind = First;
      func_type.super_ExternType._12_4_ = 0;
      func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      wabt::interp::RefPtr<wabt::interp::Instance>::reset
                ((RefPtr<wabt::interp::Instance> *)&func_type);
      bVar2 = out_instance->obj_ == (Instance *)0x0;
      if (bVar2) {
        wabt::interp::WriteTrap
                  ((Stream *)
                   stream._M_t.
                   super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>
                   .super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl,
                   "error initialiazing module",&trap);
      }
      EVar7 = (Enum)bVar2;
      wabt::interp::RefPtr<wabt::interp::Trap>::reset(&trap);
      std::_Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::~_Vector_base
                (&imports.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>)
      ;
      wabt::interp::RefPtr<wabt::interp::Module>::reset(&module);
    }
    wabt::interp::ModuleDesc::~ModuleDesc(&module_desc);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return (Result)EVar7;
}

Assistant:

Result ReadAndInstantiateModule(const char* module_filename,
                                Errors* errors,
                                Instance::Ptr* out_instance) {
  auto* stream = s_stdout_stream.get();
  std::vector<uint8_t> file_data;
  CHECK_RESULT(ReadFile(module_filename, &file_data));

  ModuleDesc module_desc;
  const bool kReadDebugNames = true;
  const bool kStopOnFirstError = true;
  const bool kFailOnCustomSectionError = true;
  ReadBinaryOptions options(s_features, s_log_stream.get(), kReadDebugNames,
                            kStopOnFirstError, kFailOnCustomSectionError);
  CHECK_RESULT(ReadBinaryInterp(file_data.data(), file_data.size(), options,
                                errors, &module_desc));

  if (s_verbose) {
    module_desc.istream.Disassemble(stream);
  }

  auto module = Module::New(s_store, module_desc);

  RefVec imports;
  for (auto&& import : module_desc.imports) {
    if (import.type.type->kind == ExternKind::Func &&
        ((s_host_print && import.type.module == "host" &&
          import.type.name == "print") ||
         s_dummy_import_func)) {
      auto func_type = *cast<FuncType>(import.type.type.get());
      auto import_name = StringPrintf("%s.%s", import.type.module.c_str(),
                                      import.type.name.c_str());

      auto host_func =
          HostFunc::New(s_store, func_type,
                        [=](const Values& params, Values& results,
                            Trap::Ptr* trap) -> Result {
                          printf("called host ");
                          WriteCall(stream, import_name, func_type, params,
                                    results, *trap);
                          return Result::Ok;
                        });
      imports.push_back(host_func.ref());
      continue;
    }

    // By default, just push an null reference. This won't resolve, and
    // instantiation will fail.
    imports.push_back(Ref::Null);
  }

  RefPtr<Trap> trap;
  *out_instance = Instance::Instantiate(s_store, module.ref(), imports, &trap);
  if (!*out_instance) {
    // TODO: change to "initializing"
    WriteTrap(stream, "error initialiazing module", trap);
    return Result::Error;
  }

  return Result::Ok;
}